

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall
iu_MatcherFailure_x_iutest_x_Equals_Test::Body(iu_MatcherFailure_x_iutest_x_Equals_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  string local_268;
  AssertionResult iutest_spi_ar;
  string local_220;
  AssertionResult iutest_ar;
  int local_1d4;
  iuCodeMessage local_1d0;
  undefined1 local_1a0 [392];
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1a0._0_8_ = &PTR__IMatcher_00225ca8;
  local_1a0._8_8_ = "Hoge";
  iutest::detail::EqMatcher<char[5]>::operator()
            (&iutest_ar,(EqMatcher<char[5]> *)local_1a0,(char (*) [5])0x1e84a2);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::PrintToString<char[5]>(&local_220,(char (*) [5])0x1e84a2);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_268,(detail *)local_220._M_dataplus._M_p,"Equals(\"Hoge\")",(char *)&iutest_ar
               ,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x266,(char *)CONCAT44(local_268._M_dataplus._M_p._4_4_,
                                       local_268._M_dataplus._M_p._0_4_));
    local_1d0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_220);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"Eq: Hoge",(allocator<char> *)&local_1d0);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x266,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  local_1d0.m_message._M_dataplus._M_p._0_4_ = 1;
  local_1a0._0_8_ = &PTR__IMatcher_00224340;
  local_268._M_dataplus._M_p._0_4_ = 0;
  local_1a0._8_8_ = &local_1d0;
  iutest::detail::EqMatcher<int>::operator()
            (&iutest_ar,(EqMatcher<int> *)local_1a0,(int *)&local_268);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    local_1d4 = 0;
    iutest::PrintToString<int>(&local_220,&local_1d4);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_268,(detail *)local_220._M_dataplus._M_p,"Equals(1)",(char *)&iutest_ar,in_R8)
    ;
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x267,(char *)CONCAT44(local_268._M_dataplus._M_p._4_4_,
                                       local_268._M_dataplus._M_p._0_4_));
    local_1d0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_220);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"Eq: 1",(allocator<char> *)&local_1d0);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x267,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)local_1a0);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(MatcherFailure, Equals)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", Equals("Hoge")) , "Eq: Hoge" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(0, Equals(1)), "Eq: 1" );
}